

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O0

void Abc_SclHashCells(SC_Lib *p)

{
  int iVar1;
  int *piVar2;
  undefined8 *puVar3;
  int *pPlace;
  int i;
  SC_Cell *pCell;
  SC_Lib *p_local;
  
  if (p->nBins != 0) {
    __assert_fail("p->nBins == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLibUtil.c"
                  ,0x45,"void Abc_SclHashCells(SC_Lib *)");
  }
  iVar1 = SC_LibCellNum(p);
  iVar1 = Abc_PrimeCudd(iVar1 * 5);
  p->nBins = iVar1;
  piVar2 = (int *)malloc((long)p->nBins << 2);
  memset(piVar2,0xff,(long)p->nBins << 2);
  p->pBins = piVar2;
  pPlace._4_4_ = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(&p->vCells);
    if (iVar1 <= pPlace._4_4_) {
      return;
    }
    puVar3 = (undefined8 *)Vec_PtrEntry(&p->vCells,pPlace._4_4_);
    piVar2 = Abc_SclHashLookup(p,(char *)*puVar3);
    if (*piVar2 != -1) break;
    *piVar2 = pPlace._4_4_;
    pPlace._4_4_ = pPlace._4_4_ + 1;
  }
  __assert_fail("*pPlace == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLibUtil.c"
                ,0x4b,"void Abc_SclHashCells(SC_Lib *)");
}

Assistant:

void Abc_SclHashCells( SC_Lib * p )
{
    SC_Cell * pCell;
    int i, * pPlace;
    assert( p->nBins == 0 );
    p->nBins = Abc_PrimeCudd( 5 * SC_LibCellNum(p) );
    p->pBins = ABC_FALLOC( int, p->nBins );
    SC_LibForEachCell( p, pCell, i )
    {
        pPlace = Abc_SclHashLookup( p, pCell->pName );
        assert( *pPlace == -1 );
        *pPlace = i;
    }
}